

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

wchar_t read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  __mode_t p;
  wchar_t wVar3;
  wchar_t wVar4;
  mode_t mVar5;
  int iVar6;
  mtree_entry *pmVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ushort **ppuVar11;
  size_t sVar12;
  mtree_entry **ppmVar13;
  archive_rb_node *paVar14;
  archive_rb_node *paVar15;
  size_t len;
  mtree_entry *pmVar16;
  ulong uVar17;
  la_int64_t lVar18;
  char *pcVar19;
  mtree_entry *pmVar20;
  char *pcVar21;
  size_t sVar22;
  __dev_t _Var23;
  ulong uVar24;
  archive_entry *rbt;
  char *pcVar25;
  mtree_option **global_00;
  char cVar26;
  uint uVar27;
  byte *pbVar28;
  long lVar29;
  undefined1 *puVar30;
  mtree_entry *pmVar31;
  mtree_entry *pmVar32;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat_conflict1 st_storage;
  long local_120;
  archive_entry *local_118;
  wchar_t local_10c;
  mtree_entry *local_108;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  archive_entry *local_f0;
  ulong local_e8;
  mtree_entry *local_e0;
  archive_rb_tree *local_d8;
  archive_entry *local_d0;
  mtree_entry **local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (L'\xffffffff' < mtree->fd) {
    close(mtree->fd);
    mtree->fd = L'\xffffffff';
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      uVar24 = 0xffffffe2;
      goto LAB_0014c2ca;
    }
    local_f0 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = L'\x00080000';
    mtree->archive_format_name = "mtree";
    local_118 = (archive_entry *)0x0;
    detect_form(a,(wchar_t *)&local_d0);
    local_120 = 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = &mtree->entries;
      local_d8 = &mtree->rbtree;
      local_f8 = (mtree_entry *)0x0;
LAB_0014bacb:
      lVar29 = 0;
      uVar17 = 0;
      do {
        _Var23 = local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_0014c2b7;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          _Var23 = (long)pvVar9 + (1 - (long)__s);
          local_c0.st_dev = _Var23;
        }
        if (0xffff < (long)(_Var23 + uVar17)) {
          pcVar19 = "Line too long";
          iVar6 = 0x54;
          goto LAB_0014c2b0;
        }
        paVar10 = archive_string_ensure((archive_string *)mtree,_Var23 + uVar17 + 1);
        if (paVar10 == (archive_string *)0x0) {
          pcVar19 = "Can\'t allocate working buffer";
          iVar6 = 0xc;
          goto LAB_0014c2b0;
        }
        memcpy((mtree->line).s + uVar17,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        uVar24 = local_c0.st_dev + uVar17;
        (mtree->line).s[uVar24] = '\0';
        pmVar7 = (mtree_entry *)(mtree->line).s;
        pbVar28 = (byte *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
LAB_0014bb64:
        bVar1 = *pbVar28;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_0014bba2;
          }
          else {
            if (bVar1 == 0) goto LAB_0014bba2;
            if (bVar1 == 10) {
              if (uVar24 == 0) break;
              if (-1 < (long)uVar24) {
                lVar29 = 0;
                pmVar31 = pmVar7;
                goto LAB_0014bbfb;
              }
              free_options((mtree_option *)local_118);
              entry = local_f0;
              if ((int)uVar24 != 0) goto LAB_0014c2ca;
              goto LAB_0014b66c;
            }
          }
LAB_0014bb9a:
          pbVar28 = pbVar28 + 1;
          goto LAB_0014bb64;
        }
        if ((bVar1 != 0x5c) || (pbVar28[1] == 0)) goto LAB_0014bb9a;
        if (pbVar28[1] != 10) {
          pbVar28 = pbVar28 + 1;
          goto LAB_0014bb9a;
        }
        *(char *)((long)(pmVar7->rbnode).rb_nodes + (uVar24 - 2)) = '\0';
        uVar24 = uVar24 - 2;
        pmVar7 = (mtree_entry *)(mtree->line).s;
LAB_0014bba2:
        lVar29 = (long)pbVar28 - (long)pmVar7;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        uVar17 = uVar24;
      } while (__s != (void *)0x0);
    }
LAB_0014c0f3:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_118);
    entry = local_f0;
  }
LAB_0014b66c:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar7 = mtree->this_entry;
  uVar24 = 1;
  if (pmVar7 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    rbt = (archive_entry *)&mtree->rbtree;
    local_f0 = rbt;
    do {
      pcVar19 = pmVar7->name;
      if (((*pcVar19 == '.') && (pcVar19[1] == '.')) && (pcVar19[2] == '\0')) {
        pmVar7->used = '\x01';
        sVar22 = (mtree->current_dir).length;
        if (sVar22 != 0) {
          pcVar19 = paVar10->s;
          pcVar21 = pcVar19 + sVar22;
          do {
            pcVar25 = pcVar21;
            pcVar21 = pcVar25 + -1;
            if (pcVar21 < pcVar19) break;
          } while (*pcVar21 != '/');
          pcVar25 = pcVar25 + -2;
          if (pcVar21 < pcVar19) {
            pcVar25 = pcVar21;
          }
          (mtree->current_dir).length = (size_t)(pcVar25 + (1 - (long)pcVar19));
        }
      }
      else if (pmVar7->used == '\0') {
        pmVar7->used = '\x01';
        local_118 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_10c = L'\0';
        wVar3 = parse_line(a,entry,mtree,pmVar7,&local_10c);
        if (pmVar7->full == '\0') {
          sVar22 = (mtree->current_dir).length;
          if (sVar22 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar7->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar5 = archive_entry_filetype(entry);
          rbt = local_f0;
          if (mVar5 != 0x4000) {
            (mtree->current_dir).length = sVar22;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar7->name);
          for (pmVar7 = (mtree_entry *)
                        __archive_rb_tree_find_node((archive_rb_tree *)rbt,pmVar7->name);
              pmVar7 != (mtree_entry *)0x0; pmVar7 = pmVar7->next_dup) {
            if ((pmVar7->full != '\0') && (pmVar7->used == '\0')) {
              pmVar7->used = '\x01';
              wVar4 = parse_line(a,entry,mtree,pmVar7,&local_10c);
              if (wVar4 < wVar3) {
                wVar3 = wVar4;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_0014c246:
          lVar18 = archive_entry_size(entry);
          mtree->cur_size = lVar18;
          mtree->offset = 0;
        }
        else {
          mtree->fd = L'\xffffffff';
          if ((mtree->contents_name).length == 0) {
            pcVar19 = archive_entry_pathname(entry);
          }
          else {
            pcVar19 = (mtree->contents_name).s;
          }
          mVar5 = archive_entry_filetype(entry);
          if ((mVar5 == 0x8000) || (mVar5 = archive_entry_filetype(entry), mVar5 == 0x4000)) {
            wVar4 = open(pcVar19,0x80000);
            mtree->fd = wVar4;
            __archive_ensure_cloexec_flag(wVar4);
            wVar4 = mtree->fd;
            if (wVar4 == L'\xffffffff') {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar19);
                wVar3 = L'\xffffffec';
              }
              goto LAB_0014b865;
            }
          }
          else {
LAB_0014b865:
            wVar4 = mtree->fd;
          }
          if (wVar4 < L'\0') {
            iVar6 = lstat(pcVar19,&local_c0);
            if (iVar6 != -1) goto LAB_0014b8be;
LAB_0014b8f6:
            if ((local_10c & 0x800U) == 0) goto LAB_0014c246;
LAB_0014ba11:
            pmVar7 = mtree->this_entry;
            goto LAB_0014ba1a;
          }
          iVar6 = fstat(wVar4,&local_c0);
          if (iVar6 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar19);
            close(mtree->fd);
            mtree->fd = L'\xffffffff';
            wVar3 = L'\xffffffec';
            goto LAB_0014b8f6;
          }
LAB_0014b8be:
          p = local_c0.st_mode;
          uVar27 = local_c0.st_mode & 0xf000;
          if (uVar27 == 0xa000) {
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 != 0xa000) goto LAB_0014b960;
LAB_0014c113:
            wVar4 = local_10c;
            if (((local_10c & 0x1001U) != 1) &&
               ((mVar5 = archive_entry_filetype(entry), mVar5 == 0x2000 ||
                (mVar5 = archive_entry_filetype(entry), mVar5 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((wVar4 & 0xcU) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((wVar4 & 0x600U) == 0 || ((uint)wVar4 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((wVar4 & 0x1010U) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((wVar4 & 0x1020U) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((wVar4 & 0x1040U) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((wVar4 & 0x1080U) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_118,&local_d0);
            entry = local_118;
            goto LAB_0014c246;
          }
          if ((uVar27 == 0x8000) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0x8000))
          goto LAB_0014c113;
LAB_0014b960:
          if (((~p & 0xc000) == 0) && (mVar5 = archive_entry_filetype(entry), mVar5 == 0xc000))
          goto LAB_0014c113;
          switch(uVar27 - 0x1000 >> 0xc) {
          case 0:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x1000) goto LAB_0014c113;
            break;
          case 1:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x2000) goto LAB_0014c113;
            break;
          case 3:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x4000) goto LAB_0014c113;
            break;
          case 5:
            mVar5 = archive_entry_filetype(entry);
            if (mVar5 == 0x6000) goto LAB_0014c113;
          }
          if (L'\xffffffff' < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = L'\xffffffff';
          if ((local_10c & 0x800U) != 0) goto LAB_0014ba11;
          if (wVar3 == L'\0') {
            pcVar19 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar19
                             );
            wVar3 = L'\xffffffec';
          }
        }
        uVar24 = (ulong)(uint)wVar3;
        goto LAB_0014c2ca;
      }
LAB_0014ba1a:
      pmVar7 = pmVar7->next;
      mtree->this_entry = pmVar7;
    } while (pmVar7 != (mtree_entry *)0x0);
    uVar24 = 1;
  }
LAB_0014c2ca:
  return (wchar_t)uVar24;
LAB_0014bbfb:
  pmVar31 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + 1);
  bVar1 = *(byte *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
  uVar24 = (ulong)bVar1;
  if (0x23 < uVar24) goto LAB_0014bc56;
  if ((0x100000200U >> (uVar24 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar24 & 0x3f) & 1) != 0) goto LAB_0014bc2a;
    goto LAB_0014bc56;
  }
  lVar29 = lVar29 + 1;
  goto LAB_0014bbfb;
LAB_0014bc56:
  pmVar16 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + lVar29);
  uVar24 = (local_c0.st_dev + uVar17) - lVar29;
  pmVar32 = (mtree_entry *)((long)pmVar16 + (uVar24 - 1));
  if (pmVar16 < pmVar32) {
    local_100 = pmVar16;
    local_e8 = uVar24;
    ppuVar11 = __ctype_b_loc();
    pmVar20 = local_100;
    do {
      if ((*(byte *)((long)*ppuVar11 + (ulong)*(byte *)(pmVar20->rbnode).rb_nodes * 2 + 1) & 0x40)
          == 0) goto LAB_0014c2df;
      pmVar20 = (mtree_entry *)((long)(pmVar20->rbnode).rb_nodes + 1);
      uVar24 = local_e8;
      pmVar16 = local_100;
    } while (pmVar20 < pmVar32);
  }
  wVar3 = (wchar_t)local_d0;
  if (bVar1 != 0x2f) {
    local_100 = pmVar16;
    local_e8 = uVar24;
    local_e0 = (mtree_entry *)malloc(0x40);
    if (local_e0 != (mtree_entry *)0x0) {
      *(undefined8 *)((long)&local_e0->options + 2) = 0;
      *(undefined8 *)((long)&local_e0->name + 2) = 0;
      local_e0->next = (mtree_entry *)0x0;
      local_e0->options = (mtree_option *)0x0;
      ppmVar13 = &local_f8->next;
      if (local_f8 == (mtree_entry *)0x0) {
        ppmVar13 = local_c8;
      }
      *ppmVar13 = local_e0;
      local_108 = local_e0;
      if (wVar3 != L'\0') {
        uVar24 = local_e8;
        local_f8 = local_100;
        if (0 < (long)local_e8) {
LAB_0014be58:
          uVar17 = (ulong)*(byte *)(pmVar32->rbnode).rb_nodes;
          if ((uVar17 < 0x21) && ((0x100002600U >> (uVar17 & 0x3f) & 1) != 0))
          goto code_r0x0014be70;
          uVar17 = 0;
          do {
            if (((ulong)(byte)pmVar31[-1].field_0x3f < 0x21) &&
               ((0x100002600U >> ((ulong)(byte)pmVar31[-1].field_0x3f & 0x3f) & 1) != 0)) {
              local_f8 = pmVar31;
            }
            uVar17 = uVar17 + 1;
            pmVar31 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + 1);
          } while (uVar24 != uVar17);
        }
        goto LAB_0014be8a;
      }
      pcVar19 = (char *)strcspn((char *)local_100," \t\r\n");
      pmVar7 = (mtree_entry *)(pcVar19 + (long)((long)(pmVar7->rbnode).rb_nodes + lVar29));
      local_f8 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + local_e8);
      goto LAB_0014bf6d;
    }
    goto LAB_0014c31f;
  }
  if (4 < (long)uVar24) {
    iVar6 = strncmp((char *)pmVar16,"/set",4);
    if (iVar6 == 0) {
      cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 4);
      if ((cVar26 == ' ') || (cVar26 == '\t')) {
        pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 4);
        while (sVar12 = strspn(pcVar19," \t\r\n"), pcVar19[sVar12] != '\0') {
          pcVar25 = pcVar19 + sVar12;
          sVar12 = strcspn(pcVar25," \t\r\n");
          pcVar19 = pcVar25 + sVar12;
          pcVar21 = strchr(pcVar25,0x3d);
          sVar22 = (long)pcVar21 - (long)pcVar25;
          if (pcVar19 < pcVar21) {
            sVar22 = sVar12;
          }
          remove_option((mtree_option **)&local_118,pcVar25,sVar22);
          wVar3 = add_option(a,(mtree_option **)&local_118,pcVar25,sVar12);
          uVar24 = (ulong)(uint)wVar3;
          if (wVar3 != L'\0') goto LAB_0014c2bd;
        }
        goto LAB_0014bc2a;
      }
      goto LAB_0014c2df;
    }
    if (((uVar24 < 7) || (iVar6 = strncmp((char *)pmVar16,"/unset",6), iVar6 != 0)) ||
       ((cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6), cVar26 != ' ' &&
        (cVar26 != '\t')))) goto LAB_0014c2df;
    pcVar21 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6);
    pcVar19 = strchr(pcVar21,0x3d);
    if (pcVar19 == (char *)0x0) {
      sVar12 = strspn(pcVar21," \t\r\n");
      cVar26 = *(char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + 6 + sVar12);
      if (cVar26 != '\0') {
        pcVar19 = (char *)((long)(pmVar7->rbnode).rb_nodes + lVar29 + sVar12 + 6);
        do {
          sVar12 = strcspn(pcVar19," \t\r\n");
          sVar22 = sVar12;
          if (sVar12 == 3) {
            if (((cVar26 != 'a') || (pcVar19[1] != 'l')) || (pcVar19[2] != 'l')) {
              sVar22 = 3;
              goto LAB_0014bdc1;
            }
            free_options((mtree_option *)local_118);
            local_118 = (archive_entry *)0x0;
          }
          else {
LAB_0014bdc1:
            remove_option((mtree_option **)&local_118,pcVar19,sVar22);
          }
          pcVar19 = pcVar19 + sVar12;
          sVar12 = strspn(pcVar19," \t\r\n");
          cVar26 = pcVar19[sVar12];
          pcVar19 = pcVar19 + sVar12;
        } while (cVar26 != '\0');
      }
      goto LAB_0014bc2a;
    }
    pcVar19 = "/unset shall not contain `=\'";
    iVar6 = -1;
    goto LAB_0014c2b0;
  }
LAB_0014c2df:
  archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_120);
LAB_0014c2b7:
  uVar24 = 0xffffffe2;
LAB_0014c2bd:
  free_options((mtree_option *)local_118);
  goto LAB_0014c2ca;
code_r0x0014be70:
  pmVar32 = (mtree_entry *)&pmVar32[-1].field_0x3f;
  bVar2 = (long)uVar24 < 2;
  uVar24 = uVar24 - 1;
  if (bVar2) goto code_r0x0014be80;
  goto LAB_0014be58;
code_r0x0014be80:
  uVar24 = 0;
LAB_0014be8a:
  pcVar19 = (char *)((long)pmVar7 + lVar29 + (uVar24 - (long)local_f8));
  pmVar7 = local_100;
  local_100 = local_f8;
LAB_0014bf6d:
  pmVar31 = local_108;
  pcVar21 = (char *)malloc((size_t)(pcVar19 + 1));
  pmVar31->name = pcVar21;
  if (pcVar21 != (char *)0x0) {
    memcpy(pcVar21,local_100,(size_t)pcVar19);
    pcVar21[(long)pcVar19] = '\0';
    parse_escapes(pcVar21,pmVar31);
    pmVar16 = local_e0;
    pmVar31->next_dup = (mtree_entry *)0x0;
    if ((pmVar31->full != '\0') &&
       (iVar6 = __archive_rb_tree_insert_node(local_d8,&pmVar31->rbnode), iVar6 == 0)) {
      paVar14 = __archive_rb_tree_find_node(local_d8,pmVar31->name);
      do {
        paVar15 = paVar14;
        paVar14 = paVar15[1].rb_nodes[0];
      } while (paVar14 != (archive_rb_node *)0x0);
      paVar15[1].rb_nodes[0] = &pmVar31->rbnode;
    }
    global_00 = &pmVar16->options;
    puVar30 = (undefined1 *)&local_118;
    while (puVar30 = *(undefined1 **)puVar30, puVar30 != (undefined1 *)0x0) {
      pcVar19 = *(char **)((long)puVar30 + 8);
      sVar12 = strlen(pcVar19);
      wVar3 = add_option(a,global_00,pcVar19,sVar12);
      if (wVar3 != L'\0') goto LAB_0014c2fd;
    }
    while ((sVar12 = strspn((char *)pmVar7," \t\r\n"),
           *(char *)((long)(pmVar7->rbnode).rb_nodes + sVar12) != '\0' &&
           (pmVar31 = (mtree_entry *)((long)(pmVar7->rbnode).rb_nodes + sVar12), pmVar31 < local_f8)
           )) {
      len = strcspn((char *)pmVar31," \t\r\n");
      pmVar7 = (mtree_entry *)((long)(pmVar31->rbnode).rb_nodes + len);
      pmVar16 = (mtree_entry *)strchr((char *)pmVar31,0x3d);
      sVar12 = (long)pmVar16 - (long)pmVar31;
      if (pmVar7 < pmVar16) {
        sVar12 = len;
      }
      if (pmVar16 == (mtree_entry *)0x0) {
        sVar12 = len;
      }
      remove_option(global_00,(char *)pmVar31,sVar12);
      wVar3 = add_option(a,global_00,(char *)pmVar31,len);
      if (wVar3 != L'\0') goto LAB_0014c2fd;
    }
    local_f8 = local_108;
LAB_0014bc2a:
    local_120 = local_120 + 1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_0014c0f3;
    goto LAB_0014bacb;
  }
LAB_0014c31f:
  piVar8 = __errno_location();
  iVar6 = *piVar8;
  pcVar19 = "Can\'t allocate memory";
LAB_0014c2b0:
  archive_set_error(&a->archive,iVar6,pcVar19);
  goto LAB_0014c2b7;
LAB_0014c2fd:
  uVar24 = (ulong)(uint)wVar3;
  goto LAB_0014c2bd;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      /*
       * Do not increment filename_size here as the computations below
       * add the space for the terminating NUL explicitly.
       */
      filename[filename_size] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }
  else if (rar->filename_must_match)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Mismatch of file parts split across multi-volume archive");
    return (ARCHIVE_FATAL);
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
  rar->ppmd_valid = rar->ppmd_eod = 0;
  rar->filters.filterstart = INT64_MAX;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}